

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_sequencetask.cc
# Opt level: O0

void SequenceSpanTask::run(search *sch,multi_ex *ec)

{
  task_data *ptVar1;
  v_array<unsigned_int> *this;
  size_type sVar2;
  size_t sVar3;
  uint *puVar4;
  vector<example_*,_std::allocator<example_*>_> *in_RSI;
  search *in_RDI;
  action other;
  size_t len;
  action oracle;
  size_t i;
  action last_prediction;
  size_t pass;
  predictor P;
  v_array<unsigned_int> *y_allowed;
  task_data *D;
  undefined4 in_stack_fffffffffffffe28;
  action in_stack_fffffffffffffe2c;
  predictor *in_stack_fffffffffffffe30;
  action in_stack_fffffffffffffe38;
  action in_stack_fffffffffffffe3c;
  predictor *in_stack_fffffffffffffe40;
  predictor *in_stack_fffffffffffffe48;
  undefined7 in_stack_fffffffffffffe50;
  byte in_stack_fffffffffffffe57;
  undefined8 in_stack_fffffffffffffed0;
  ptag my_tag;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  predictor *in_stack_fffffffffffffee0;
  ulong uVar5;
  ulong __n;
  uint local_114;
  ulong local_110;
  predictor *in_stack_ffffffffffffff08;
  
  my_tag = (ptag)((ulong)in_stack_fffffffffffffed0 >> 0x20);
  ptVar1 = Search::search::get_task_data<SequenceSpanTask::task_data>(in_RDI);
  this = &ptVar1->allowed_actions;
  Search::predictor::predictor
            (in_stack_fffffffffffffee0,
             (search *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),my_tag);
  for (local_110 = 1; local_110 <= ptVar1->multipass; local_110 = local_110 + 1) {
    local_114 = 1;
    uVar5 = 0;
    while (__n = uVar5, sVar2 = std::vector<example_*,_std::allocator<example_*>_>::size(in_RSI),
          uVar5 < sVar2) {
      std::vector<example_*,_std::allocator<example_*>_>::operator[](in_RSI,__n);
      sVar3 = v_array<unsigned_int>::size(this);
      Search::predictor::set_tag((predictor *)&stack0xfffffffffffffef8,(int)__n + 1);
      Search::predictor::set_learner_id((predictor *)&stack0xfffffffffffffef8,local_110 - 1);
      if (ptVar1->encoding == BIO) {
        if (local_114 == 1) {
          v_array<unsigned_int>::begin(this);
          Search::predictor::set_allowed
                    (in_stack_fffffffffffffe30,
                     (action *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                     0x155b78);
        }
        else if ((local_114 & 1) == 0) {
          puVar4 = v_array<unsigned_int>::operator[](this,sVar3 - 1);
          *puVar4 = local_114 + 1;
          Search::predictor::set_allowed
                    ((predictor *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50),
                     (v_array<unsigned_int> *)in_stack_fffffffffffffe48);
        }
        else {
          puVar4 = v_array<unsigned_int>::operator[](this,sVar3 - 1);
          *puVar4 = local_114;
          Search::predictor::set_allowed
                    ((predictor *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50),
                     (v_array<unsigned_int> *)in_stack_fffffffffffffe48);
        }
      }
      else if (ptVar1->encoding == BILOU) {
        if (((local_114 == 1) || ((local_114 - 2 & 3) == 0)) || ((local_114 - 2 & 3) == 3)) {
          Search::predictor::set_allowed
                    ((predictor *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50),
                     (v_array<unsigned_int> *)in_stack_fffffffffffffe48);
        }
        else {
          Search::predictor::set_allowed(in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c);
          Search::predictor::add_allowed(in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c);
        }
      }
      std::vector<example_*,_std::allocator<example_*>_>::operator[](in_RSI,__n);
      Search::predictor::set_input
                (in_stack_fffffffffffffe30,
                 (example *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
      Search::search::get_history_length(in_RDI);
      Search::predictor::set_condition_range
                (in_stack_fffffffffffffe40,in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38,
                 (char)((ulong)in_stack_fffffffffffffe30 >> 0x38));
      if (1 < local_110) {
        Search::search::get_history_length(in_RDI);
        Search::search::get_history_length(in_RDI);
        Search::predictor::add_condition_range
                  (in_stack_fffffffffffffe48,(ptag)((ulong)in_stack_fffffffffffffe40 >> 0x20),
                   (ptag)in_stack_fffffffffffffe40,(char)(in_stack_fffffffffffffe3c >> 0x18));
      }
      Search::predictor::set_oracle(in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c);
      local_114 = Search::predictor::predict(in_stack_ffffffffffffff08);
      if (local_110 == ptVar1->multipass) {
        Search::search::output_abi_cxx11_(in_RDI);
        in_stack_fffffffffffffe57 = std::ios::good();
        if ((in_stack_fffffffffffffe57 & 1) != 0) {
          in_stack_fffffffffffffe48 = (predictor *)Search::search::output_abi_cxx11_(in_RDI);
          in_stack_fffffffffffffe40 = (predictor *)&in_stack_fffffffffffffe48->ec_cnt;
          in_stack_fffffffffffffe3c = local_114;
          if (ptVar1->encoding != BIO) {
            in_stack_fffffffffffffe38 = bilou_to_bio(local_114);
            in_stack_fffffffffffffe3c = in_stack_fffffffffffffe38;
          }
          in_stack_fffffffffffffe30 =
               (predictor *)
               std::ostream::operator<<(in_stack_fffffffffffffe40,in_stack_fffffffffffffe3c);
          std::operator<<((ostream *)in_stack_fffffffffffffe30,' ');
        }
      }
      uVar5 = __n + 1;
    }
  }
  Search::predictor::~predictor(in_stack_fffffffffffffe30);
  return;
}

Assistant:

void run(Search::search& sch, multi_ex& ec)
{
  task_data& D = *sch.get_task_data<task_data>();
  v_array<action>* y_allowed = &(D.allowed_actions);
  Search::predictor P(sch, (ptag)0);
  for (size_t pass = 1; pass <= D.multipass; pass++)
  {
    action last_prediction = 1;
    for (size_t i = 0; i < ec.size(); i++)
    {
      action oracle = ec[i]->l.multi.label;
      size_t len = y_allowed->size();
      P.set_tag((ptag)i + 1);
      P.set_learner_id(pass - 1);
      if (D.encoding == BIO)
      {
        if (last_prediction == 1)
          P.set_allowed(y_allowed->begin(), len - 1);
        else if (last_prediction % 2 == 0)
        {
          (*y_allowed)[len - 1] = last_prediction + 1;
          P.set_allowed(*y_allowed);
        }
        else
        {
          (*y_allowed)[len - 1] = last_prediction;
          P.set_allowed(*y_allowed);
        }
        if ((oracle > 1) && (oracle % 2 == 1) && (last_prediction != oracle) && (last_prediction != oracle - 1))
          oracle = 1;  // if we are supposed to I-X, but last wasn't B-X or I-X, then say O
      }
      else if (D.encoding == BILOU)
      {
        if ((last_prediction == 1) || ((last_prediction - 2) % 4 == 0) ||
            ((last_prediction - 2) % 4 == 3))  // O or unit-X or last-X
        {
          P.set_allowed(D.allowed_actions);
          // we cannot allow in-X or last-X next
          if ((oracle > 1) && (((oracle - 2) % 4 == 2) || ((oracle - 2) % 4 == 3)))
            oracle = 1;
        }
        else  // begin-X or in-X
        {
          action other = ((last_prediction - 2) % 4 == 1) ? (last_prediction + 2) : last_prediction;
          P.set_allowed(last_prediction + 1);
          P.add_allowed(other);
          if ((oracle != last_prediction + 1) && (oracle != other))
            oracle = other;
        }
      }
      P.set_input(*ec[i]);
      P.set_condition_range((ptag)i, sch.get_history_length(), 'p');
      if (pass > 1)
        P.add_condition_range((ptag)(i + 1 + sch.get_history_length()), sch.get_history_length() + 1, 'a');
      P.set_oracle(oracle);
      last_prediction = P.predict();

      if ((pass == D.multipass) && sch.output().good())
        sch.output() << ((D.encoding == BIO) ? last_prediction : bilou_to_bio(last_prediction)) << ' ';
    }
  }
}